

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeArray<std::array<int,3ul>>
          (AsciiParser *this,
          vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *result)

{
  pointer paVar1;
  bool bVar2;
  undefined8 in_RAX;
  char c;
  
  c = (char)((ulong)in_RAX >> 0x38);
  bVar2 = Expect(this,'[');
  if ((bVar2) && (bVar2 = SkipCommentAndWhitespaceAndNewline(this,true), bVar2)) {
    bVar2 = Char1(this,&c);
    if (!bVar2) {
      return bVar2;
    }
    if (c == ']') {
      paVar1 = (result->
               super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((result->super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)
          ._M_impl.super__Vector_impl_data._M_finish == paVar1) {
        return bVar2;
      }
      (result->super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>).
      _M_impl.super__Vector_impl_data._M_finish = paVar1;
      return bVar2;
    }
    Rewind(this,1);
    bVar2 = SepBy1BasicType<std::array<int,3ul>>(this,',',']',result);
    if ((bVar2) && (bVar2 = SkipCommentAndWhitespaceAndNewline(this,true), bVar2)) {
      bVar2 = Expect(this,']');
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseBasicTypeArray(std::vector<T> *result) {
  if (!Expect('[')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  // Empty array?
  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == ']') {
      result->clear();
      return true;
    }

    Rewind(1);
  }

  if (!SepBy1BasicType<T>(',', ']', result)) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  if (!Expect(']')) {
    return false;
  }
  return true;
}